

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findstr.cpp
# Opt level: O2

string * __thiscall
hexpattern::datamask2regex_abi_cxx11_
          (string *__return_storage_ptr__,hexpattern *this,ByteMaskType *datamask)

{
  uchar uVar1;
  pointer puVar2;
  char *__s;
  int c;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint local_58;
  uint local_54;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar4 = 0;
  do {
    uVar5 = (ulong)uVar4;
    puVar2 = (datamask->first).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(datamask->first).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar2) <= uVar5) {
      return __return_storage_ptr__;
    }
    uVar1 = (datamask->second).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar5];
    __s = ".";
    if (uVar1 == '\0') {
LAB_0010b14b:
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,__s);
    }
    else {
      if (uVar1 == '\x0f') {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__,"[");
        for (uVar3 = 0; uVar3 < 0x100; uVar3 = uVar3 + 0x10) {
          local_58 = ((datamask->first).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar5] & 0xf) + uVar3;
          stringformat<int>(&local_50,"\\x%02x",(int *)&local_58);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (__return_storage_ptr__,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
        }
        __s = "]";
        goto LAB_0010b14b;
      }
      if (uVar1 == 0xf0) {
        local_58 = puVar2[uVar5] & 0xfffffff0;
        local_54 = puVar2[uVar5] | 0xf;
        stringformat<int,int>(&local_50,"[\\x%02x-\\x%02x]",(int *)&local_58,(int *)&local_54);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__,&local_50);
LAB_0010b133:
        std::__cxx11::string::~string((string *)&local_50);
      }
      else if (uVar1 == 0xff) {
        stringformat<unsigned_char_const&>(&local_50,"\\x%02x",puVar2 + uVar5);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__,&local_50);
        goto LAB_0010b133;
      }
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

std::string datamask2regex(const ByteMaskType & datamask)
    {
        auto & data = datamask.first;
        auto & mask = datamask.second;

        std::string regex;
        for (unsigned i = 0 ; i < data.size() ; i++)
        {
            switch(mask[i])
            {
                case 0: regex += "."; break;
                case 0xF0: regex += stringformat("[\\x%02x-\\x%02x]", data[i] & 0xF0, (data[i] & 0xF0) | 0x0F); break;
                case 0x0F:
                           {
                               regex += "[";
                               for (int c = 0 ; c < 0x100 ; c += 0x10)
                                   regex += stringformat("\\x%02x", c + (data[i] & 0x0F));
                               regex += "]";
                           }
                           break;
                case 0xFF: regex += stringformat("\\x%02x", data[i]); break;
            }
        }

        return regex;
    }